

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O2

bool testMethod_substr_AtEnd(String *str)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string *__lhs;
  int iVar4;
  String substr;
  
  cm::String::substr(&substr,str,1,0xffffffffffffffff);
  if (substr.view_._M_str == (str->view_)._M_str + 1) {
    if (substr.view_._M_len == 2) {
      bVar1 = cm::String::is_stable(&substr);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(!substr.is_stable()) failed on line ");
        iVar4 = 0x30c;
      }
      else {
        pcVar3 = cm::String::c_str(&substr);
        if (((*pcVar3 == 'b') && (pcVar3[1] == 'c')) && (pcVar3[2] == '\0')) {
          pcVar3 = cm::String::c_str(&substr);
          if (pcVar3 == (str->view_)._M_str + 1) {
            if (substr.view_._M_str == pcVar3) {
              if (substr.view_._M_len == 2) {
                bVar1 = cm::String::is_stable(&substr);
                if (bVar1) {
                  poVar2 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(!substr.is_stable()) failed on line ");
                  iVar4 = 0x313;
                }
                else {
                  __lhs = cm::String::str_abi_cxx11_(&substr);
                  bVar1 = std::operator==(__lhs,"bc");
                  if (bVar1) {
                    bVar1 = cm::String::is_stable(&substr);
                    if (bVar1) {
                      if (substr.view_._M_str == (str->view_)._M_str + 1) {
                        poVar2 = std::operator<<((ostream *)&std::cout,
                                                 "ASSERT_TRUE(substr.data() != str.data() + 1) failed on line "
                                                );
                        iVar4 = 0x318;
                      }
                      else if (substr.view_._M_len == 2) {
                        pcVar3 = cm::String::c_str(&substr);
                        if (pcVar3 == (str->view_)._M_str + 1) {
                          poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(substr.c_str() != str.data() + 1) failed on line "
                                                  );
                          iVar4 = 0x31a;
                        }
                        else {
                          pcVar3 = cm::String::c_str(&substr);
                          if (((*pcVar3 == 'b') && (pcVar3[1] == 'c')) && (pcVar3[2] == '\0')) {
                            bVar1 = true;
                            goto LAB_00179c84;
                          }
                          poVar2 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(std::strcmp(substr.c_str(), \"bc\") == 0) failed on line "
                                                  );
                          iVar4 = 0x31b;
                        }
                      }
                      else {
                        poVar2 = std::operator<<((ostream *)&std::cout,
                                                 "ASSERT_TRUE(substr.size() == 2) failed on line ");
                        iVar4 = 0x319;
                      }
                    }
                    else {
                      poVar2 = std::operator<<((ostream *)&std::cout,
                                               "ASSERT_TRUE(substr.is_stable()) failed on line ");
                      iVar4 = 0x317;
                    }
                  }
                  else {
                    poVar2 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(substr.str() == \"bc\") failed on line ");
                    iVar4 = 0x316;
                  }
                }
              }
              else {
                poVar2 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(substr.size() == 2) failed on line ");
                iVar4 = 0x312;
              }
            }
            else {
              poVar2 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(substr.data() == str.data() + 1) failed on line "
                                      );
              iVar4 = 0x311;
            }
          }
          else {
            poVar2 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(substr.c_str() == str.data() + 1) failed on line "
                                    );
            iVar4 = 0x310;
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(std::strcmp(substr.c_str(), \"bc\") == 0) failed on line "
                                  );
          iVar4 = 0x30f;
        }
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(substr.size() == 2) failed on line ");
      iVar4 = 0x30b;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(substr.data() == str.data() + 1) failed on line ");
    iVar4 = 0x30a;
  }
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
  std::operator<<(poVar2,"\n");
  bVar1 = false;
LAB_00179c84:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&substr.string_.
              super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return bVar1;
}

Assistant:

static bool testMethod_substr_AtEnd(cm::String str)
{
  cm::String substr = str.substr(1);
  ASSERT_TRUE(substr.data() == str.data() + 1);
  ASSERT_TRUE(substr.size() == 2);
  ASSERT_TRUE(!substr.is_stable());

  // c_str() at the end of the buffer does not internally mutate.
  ASSERT_TRUE(std::strcmp(substr.c_str(), "bc") == 0);
  ASSERT_TRUE(substr.c_str() == str.data() + 1);
  ASSERT_TRUE(substr.data() == str.data() + 1);
  ASSERT_TRUE(substr.size() == 2);
  ASSERT_TRUE(!substr.is_stable());

  // str() internally mutates.
  ASSERT_TRUE(substr.str() == "bc");
  ASSERT_TRUE(substr.is_stable());
  ASSERT_TRUE(substr.data() != str.data() + 1);
  ASSERT_TRUE(substr.size() == 2);
  ASSERT_TRUE(substr.c_str() != str.data() + 1);
  ASSERT_TRUE(std::strcmp(substr.c_str(), "bc") == 0);
  return true;
}